

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O2

void __thiscall
Imf_3_4::Array<Imf_3_4::Array<char>_>::resizeErase(Array<Imf_3_4::Array<char>_> *this,long size)

{
  Array<char> *pAVar1;
  char *pcVar2;
  long *plVar3;
  long lVar4;
  
  plVar3 = (long *)operator_new__(-(ulong)((ulong)size >> 0x3c != 0) | size << 4 | 8);
  *plVar3 = size;
  if (size != 0) {
    memset((Array<char> *)(plVar3 + 1),0,size << 4);
  }
  pAVar1 = this->_data;
  if (pAVar1 != (Array<char> *)0x0) {
    pcVar2 = pAVar1[-1]._data;
    if (pcVar2 != (char *)0x0) {
      lVar4 = (long)pcVar2 << 4;
      do {
        Array<char>::~Array((Array<char> *)((long)&pAVar1[-1]._size + lVar4));
        lVar4 = lVar4 + -0x10;
      } while (lVar4 != 0);
    }
    operator_delete__(&pAVar1[-1]._data,(long)pcVar2 << 4 | 8);
  }
  this->_size = size;
  this->_data = (Array<char> *)(plVar3 + 1);
  return;
}

Assistant:

inline void
Array<T>::resizeErase (long size)
{
    T* tmp = new T[size];
    delete[] _data;
    _size = size;
    _data = tmp;
}